

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestChildExtension::~TestChildExtension(TestChildExtension *this)

{
  TestChildExtension *this_local;
  
  ~TestChildExtension(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestChildExtension::~TestChildExtension() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestChildExtension)
  SharedDtor(*this);
}